

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O3

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesFixedBase
          (BerdyHelper *this,LinkProperAccArray *properAccs,
          LinkNetTotalWrenchesWithoutGravity *netTotalWrenchesWithoutGrav,
          LinkNetExternalWrenches *netExtWrenches,LinkInternalWrenches *linkJointWrenches,
          JointDOFsDoubleArray *jointTorques,JointDOFsDoubleArray *jointAccs,VectorDynSize *d)

{
  void *pvVar1;
  long lVar2;
  undefined8 uVar3;
  PointerType ptr;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  IndexRange IVar13;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  undefined8 local_88 [4];
  undefined8 uStack_68;
  undefined8 local_60;
  LinkNetTotalWrenchesWithoutGravity *local_58;
  LinkNetExternalWrenches *local_50;
  LinkProperAccArray *local_48;
  LinkInternalWrenches *local_40;
  JointDOFsDoubleArray *local_38;
  
  if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
    local_58 = netTotalWrenchesWithoutGrav;
    local_50 = netExtWrenches;
    local_48 = properAccs;
    local_40 = linkJointWrenches;
    local_38 = jointTorques;
    lVar4 = iDynTree::Model::getNrOfLinks();
    if (0 < lVar4) {
      lVar4 = 0;
      do {
        iDynTree::Traversal::getBaseLink();
        lVar5 = iDynTree::Link::getIndex();
        if (lVar4 != lVar5) {
          IVar13 = getRangeLinkVariable(this,LINK_BODY_PROPER_ACCELERATION,lVar4);
          uVar10 = IVar13.size;
          lVar5 = IVar13.offset;
          puVar6 = (undefined8 *)iDynTree::LinkAccArray::operator()(local_48,lVar4);
          local_88[0] = *puVar6;
          local_88[1] = puVar6[1];
          local_88[2] = puVar6[2];
          local_88[3] = puVar6[3];
          uStack_68 = puVar6[4];
          local_60 = puVar6[5];
          lVar7 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          pvVar1 = (void *)(lVar7 + lVar5 * 8);
          if ((((ulong)pvVar1 & 7) != 0) ||
             (uVar11 = (ulong)((uint)((ulong)pvVar1 >> 3) & 1), (long)uVar10 <= (long)uVar11)) {
            uVar11 = uVar10;
          }
          if (0 < (long)uVar11) {
            memcpy(pvVar1,local_88,uVar11 * 8);
          }
          lVar12 = uVar10 - uVar11;
          lVar2 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
          if (1 < lVar12) {
            lVar8 = uVar11 + 2;
            if ((long)(uVar11 + 2) < lVar2) {
              lVar8 = lVar2;
            }
            memcpy((void *)(lVar7 + (lVar5 + uVar11) * 8),local_88 + uVar11,
                   (~uVar11 + lVar8 & 0xfffffffffffffffe) * 8 + 0x10);
          }
          if (lVar2 < (long)uVar10) {
            memcpy((void *)(lVar7 + (lVar12 / 2) * 0x10 + lVar5 * 8 + uVar11 * 8),
                   local_88 + (lVar12 / 2) * 2 + uVar11,(lVar12 % 2) * 8);
          }
          IVar13 = getRangeLinkVariable(this,NET_INT_AND_EXT_WRENCHES_ON_LINK_WITHOUT_GRAV,lVar4);
          uVar10 = IVar13.size;
          lVar5 = IVar13.offset;
          lVar7 = iDynTree::LinkWrenches::operator()(local_58,lVar4);
          local_88[0] = *(undefined8 *)(lVar7 + 8);
          local_88[1] = *(undefined8 *)(lVar7 + 0x10);
          local_88[2] = *(undefined8 *)(lVar7 + 0x18);
          local_88[3] = *(undefined8 *)(lVar7 + 0x20);
          uStack_68 = *(undefined8 *)(lVar7 + 0x28);
          local_60 = *(undefined8 *)(lVar7 + 0x30);
          lVar7 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          pvVar1 = (void *)(lVar7 + lVar5 * 8);
          if ((((ulong)pvVar1 & 7) != 0) ||
             (uVar11 = (ulong)((uint)((ulong)pvVar1 >> 3) & 1), (long)uVar10 <= (long)uVar11)) {
            uVar11 = uVar10;
          }
          if (0 < (long)uVar11) {
            memcpy(pvVar1,local_88,uVar11 * 8);
          }
          lVar12 = uVar10 - uVar11;
          lVar2 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
          if (1 < lVar12) {
            lVar8 = uVar11 + 2;
            if ((long)(uVar11 + 2) < lVar2) {
              lVar8 = lVar2;
            }
            memcpy((void *)(lVar7 + (lVar5 + uVar11) * 8),local_88 + uVar11,
                   (~uVar11 + lVar8 & 0xfffffffffffffffe) * 8 + 0x10);
          }
          if (lVar2 < (long)uVar10) {
            memcpy((void *)(lVar7 + (lVar12 / 2) * 0x10 + lVar5 * 8 + uVar11 * 8),
                   local_88 + (lVar12 / 2) * 2 + uVar11,(lVar12 % 2) * 8);
          }
          if ((this->m_options).includeAllNetExternalWrenchesAsDynamicVariables == true) {
            IVar13 = getRangeLinkVariable(this,NET_EXT_WRENCH,lVar4);
            uVar10 = IVar13.size;
            lVar5 = IVar13.offset;
            lVar7 = iDynTree::LinkWrenches::operator()(local_50,lVar4);
            local_88[0] = *(undefined8 *)(lVar7 + 8);
            local_88[1] = *(undefined8 *)(lVar7 + 0x10);
            local_88[2] = *(undefined8 *)(lVar7 + 0x18);
            local_88[3] = *(undefined8 *)(lVar7 + 0x20);
            uStack_68 = *(undefined8 *)(lVar7 + 0x28);
            local_60 = *(undefined8 *)(lVar7 + 0x30);
            lVar7 = iDynTree::VectorDynSize::data();
            iDynTree::VectorDynSize::size();
            pvVar1 = (void *)(lVar7 + lVar5 * 8);
            if ((((ulong)pvVar1 & 7) != 0) ||
               (uVar11 = (ulong)((uint)((ulong)pvVar1 >> 3) & 1), (long)uVar10 <= (long)uVar11)) {
              uVar11 = uVar10;
            }
            if (0 < (long)uVar11) {
              memcpy(pvVar1,local_88,uVar11 * 8);
            }
            lVar12 = uVar10 - uVar11;
            lVar2 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
            if (1 < lVar12) {
              lVar8 = uVar11 + 2;
              if ((long)(uVar11 + 2) < lVar2) {
                lVar8 = lVar2;
              }
              memcpy((void *)(lVar7 + (lVar5 + uVar11) * 8),local_88 + uVar11,
                     (~uVar11 + lVar8 & 0xfffffffffffffffe) * 8 + 0x10);
            }
            if (lVar2 < (long)uVar10) {
              memcpy((void *)(lVar7 + (lVar12 / 2) * 0x10 + lVar5 * 8 + uVar11 * 8),
                     local_88 + (lVar12 / 2) * 2 + uVar11,(lVar12 % 2) * 8);
            }
          }
        }
        lVar4 = lVar4 + 1;
        lVar5 = iDynTree::Model::getNrOfLinks();
      } while (lVar4 < lVar5);
    }
    lVar4 = iDynTree::Model::getNrOfJoints();
    if (0 < lVar4) {
      local_58 = (LinkNetTotalWrenchesWithoutGravity *)&this->m_dynamicsTraversal;
      lVar4 = 0;
      do {
        plVar9 = (long *)iDynTree::Model::getJoint((long)this);
        lVar5 = iDynTree::Traversal::getChildLinkIndexFromJointIndex((Model *)local_58,(long)this);
        IVar13 = getRangeJointVariable(this,JOINT_WRENCH,lVar4);
        uVar11 = IVar13.size;
        lVar7 = IVar13.offset;
        lVar5 = iDynTree::LinkWrenches::operator()(local_40,lVar5);
        local_88[0] = *(undefined8 *)(lVar5 + 8);
        local_88[1] = *(undefined8 *)(lVar5 + 0x10);
        local_88[2] = *(undefined8 *)(lVar5 + 0x18);
        local_88[3] = *(undefined8 *)(lVar5 + 0x20);
        uStack_68 = *(undefined8 *)(lVar5 + 0x28);
        local_60 = *(undefined8 *)(lVar5 + 0x30);
        lVar5 = iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        pvVar1 = (void *)(lVar5 + lVar7 * 8);
        uVar10 = uVar11;
        if ((((ulong)pvVar1 & 7) == 0) &&
           (uVar10 = (ulong)((uint)((ulong)pvVar1 >> 3) & 1), (long)uVar11 <= (long)uVar10)) {
          uVar10 = uVar11;
        }
        if (0 < (long)uVar10) {
          memcpy(pvVar1,local_88,uVar10 * 8);
        }
        lVar12 = uVar11 - uVar10;
        lVar2 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
        if (1 < lVar12) {
          lVar8 = uVar10 + 2;
          if ((long)(uVar10 + 2) < lVar2) {
            lVar8 = lVar2;
          }
          memcpy((void *)(lVar5 + (lVar7 + uVar10) * 8),local_88 + uVar10,
                 (~uVar10 + lVar8 & 0xfffffffffffffffe) * 8 + 0x10);
        }
        if (lVar2 < (long)uVar11) {
          memcpy((void *)(lVar5 + (lVar12 / 2) * 0x10 + lVar7 * 8 + uVar10 * 8),
                 local_88 + (lVar12 / 2) * 2 + uVar10,(lVar12 % 2) * 8);
        }
        IVar13 = getRangeDOFVariable(this,DOF_ACCELERATION,lVar4);
        uVar10 = (**(code **)(*plVar9 + 0xc0))(plVar9);
        puVar6 = (undefined8 *)
                 iDynTree::VectorDynSize::operator()((VectorDynSize *)jointAccs,uVar10);
        uVar3 = *puVar6;
        puVar6 = (undefined8 *)iDynTree::VectorDynSize::operator()(d,IVar13.offset);
        *puVar6 = uVar3;
        IVar13 = getRangeDOFVariable(this,DOF_TORQUE,lVar4);
        uVar10 = (**(code **)(*plVar9 + 0xc0))(plVar9);
        puVar6 = (undefined8 *)iDynTree::VectorDynSize::operator()((VectorDynSize *)local_38,uVar10)
        ;
        uVar3 = *puVar6;
        puVar6 = (undefined8 *)iDynTree::VectorDynSize::operator()(d,IVar13.offset);
        *puVar6 = uVar3;
        lVar4 = lVar4 + 1;
        lVar5 = iDynTree::Model::getNrOfJoints();
      } while (lVar4 < lVar5);
    }
  }
  return true;
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesFixedBase(LinkProperAccArray& properAccs,
                                                                  LinkNetTotalWrenchesWithoutGravity& netTotalWrenchesWithoutGrav,
                                                                  LinkNetExternalWrenches& netExtWrenches,
                                                                  LinkInternalWrenches& linkJointWrenches,
                                                                  JointDOFsDoubleArray& jointTorques,
                                                                  JointDOFsDoubleArray& jointAccs,
                                                                  VectorDynSize& d)
{
    assert(d.size() == this->getNrOfDynamicVariables());
    assert(this->m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE);

    if( this->m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE )
    {
        // In the original formulation, also the totalNetWrenchesWithoutGravity where part of the variables
        // And the base link is not considered amoing the dynamic variables
        for(LinkIndex linkIdx = 0; linkIdx < static_cast<LinkIndex>(m_model.getNrOfLinks()); linkIdx++)
        {
            // The base variables are not estimated for ORIGINAL_BERDY_FIXED_BASE
            if( linkIdx != this->m_dynamicsTraversal.getBaseLink()->getIndex() )
            {
                setSubVector(d,getRangeLinkVariable(LINK_BODY_PROPER_ACCELERATION,linkIdx),toEigen(properAccs(linkIdx)));
                setSubVector(d,getRangeLinkVariable(NET_INT_AND_EXT_WRENCHES_ON_LINK_WITHOUT_GRAV,linkIdx),toEigen(netTotalWrenchesWithoutGrav(linkIdx)));
                if( m_options.includeAllNetExternalWrenchesAsDynamicVariables )
                {
                    setSubVector(d,getRangeLinkVariable(NET_EXT_WRENCH,linkIdx),toEigen(netExtWrenches(linkIdx)));
                }
            }
        }

        for(JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); jntIdx++)
        {
            IJointConstPtr jnt = m_model.getJoint(jntIdx);

            LinkIndex childLink = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model,jntIdx);
            setSubVector(d,getRangeJointVariable(JOINT_WRENCH,jntIdx),toEigen(linkJointWrenches(childLink)));

            // For ORIGINAL_BERDY_FIXED_BASE, we know that every joint has 1 dof
            setSubVector(d,getRangeDOFVariable(DOF_ACCELERATION,jntIdx),jointAccs(jnt->getDOFsOffset()));
            setSubVector(d,getRangeDOFVariable(DOF_TORQUE,jntIdx),jointTorques(jnt->getDOFsOffset()));
        }
    }

    return true;
}